

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_>::populate
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> *this,
          unary_op_tuple<trng::portable_impl::uint128,_double> *val)

{
  IGenerator<unary_op_tuple<trng::portable_impl::uint128,_double>_> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_double>_>_*,_false>
  local_18;
  
  local_18._M_head_impl = in_RAX;
  value<unary_op_tuple<trng::portable_impl::uint128,double>>((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>>
            ((vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>>>
              *)&this->m_generators,
             (GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_> *)&local_18);
  if (local_18._M_head_impl !=
      (IGenerator<unary_op_tuple<trng::portable_impl::uint128,_double>_> *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }